

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O1

void __thiscall
TPZTensor<double>::ComputeEigenvalues
          (TPZTensor<double> *this,TPZDecomposed *eigensystem,bool compute_eigenvectors)

{
  double dVar1;
  undefined8 uVar2;
  double *pdVar3;
  uint *puVar4;
  double *pdVar5;
  TPZManVector<double,_3> *pTVar6;
  bool bVar7;
  uint uVar8;
  byte bVar9;
  uint i;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  REAL realTol;
  double dVar13;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  undefined1 local_78 [16];
  ulong uStack_68;
  ulong local_60;
  undefined1 local_58 [24];
  double local_40;
  double local_38;
  undefined8 uStack_30;
  
  pdVar3 = (this->fData).super_TPZVec<double>.fStore;
  dVar13 = 0.0;
  lVar10 = 0;
  do {
    dVar13 = dVar13 + pdVar3[lVar10] * pdVar3[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 6);
  dVar13 = pdVar3[4] * pdVar3[4] + pdVar3[2] * pdVar3[2] + pdVar3[1] * pdVar3[1] + dVar13;
  if (dVar13 < 0.0) {
    dVar13 = sqrt(dVar13);
    uStack_30 = extraout_XMM0_Qb;
  }
  else {
    dVar13 = SQRT(dVar13);
    uStack_30 = 0;
  }
  local_38 = dVar13 * 1e-12;
  pdVar3 = (this->fData).super_TPZVec<double>.fStore;
  if (ABS(*pdVar3) <= local_38) {
    uVar11 = 0;
    do {
      uVar12 = uVar11;
      if (uVar12 == 5) break;
      uVar11 = uVar12 + 1;
    } while (ABS(pdVar3[uVar12 + 1]) <= local_38);
    if (4 < uVar12) {
      eigensystem->fDistinctEigenvalues = 1;
      pdVar3 = (eigensystem->fEigenvalues).super_TPZVec<double>.fStore;
      *pdVar3 = 0.0;
      pdVar3[1] = 0.0;
      pdVar3[2] = 0.0;
      puVar4 = (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore;
      puVar4[0] = 3;
      puVar4[1] = 3;
      puVar4[2] = 3;
      if (!compute_eigenvectors) {
        return;
      }
      local_40 = 0.0;
      TPZManVector<double,_3>::TPZManVector((TPZManVector<double,_3> *)local_78,3,&local_40);
      TPZManVector<double,_3>::operator=
                ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore,
                 (TPZManVector<double,_3> *)local_78);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)local_78);
      *(((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore)->
       super_TPZVec<double>).fStore = 1.0;
      local_40 = 0.0;
      TPZManVector<double,_3>::TPZManVector((TPZManVector<double,_3> *)local_78,3,&local_40);
      TPZManVector<double,_3>::operator=
                ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore + 1,
                 (TPZManVector<double,_3> *)local_78);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)local_78);
      (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore[1].
      super_TPZVec<double>.fStore[1] = 1.0;
      local_40 = 0.0;
      TPZManVector<double,_3>::TPZManVector((TPZManVector<double,_3> *)local_78,3,&local_40);
      TPZManVector<double,_3>::operator=
                ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore + 2,
                 (TPZManVector<double,_3> *)local_78);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)local_78);
      (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore[2].
      super_TPZVec<double>.fStore[2] = 1.0;
      return;
    }
  }
  if (((local_38 < ABS(pdVar3[1])) || (local_38 < ABS(pdVar3[2]))) || (local_38 < ABS(pdVar3[4]))) {
    DirectEigenValues(this,eigensystem,compute_eigenvectors);
    pdVar3 = (eigensystem->fEigenvalues).super_TPZVec<double>.fStore;
    auVar14._8_8_ = -(ulong)(ABS(pdVar3[1] - pdVar3[2]) <= local_38);
    auVar14._0_8_ = -(ulong)(ABS(*pdVar3 - pdVar3[1]) <= local_38);
    uVar8 = movmskpd((int)pdVar3,auVar14);
    if (uVar8 != 3) {
      bVar9 = (byte)uVar8;
      if (((bVar9 >> 1 | bVar9) & 1) != 0) {
        eigensystem->fDistinctEigenvalues = 2;
        puVar4 = (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore;
        puVar4[1] = 2;
        puVar4[(ulong)((byte)~bVar9 & 1) * 2] = 2;
        puVar4[(ulong)(uVar8 & 1) * 2] = 1;
        return;
      }
      eigensystem->fDistinctEigenvalues = 3;
      puVar4 = (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore;
      puVar4[0] = 1;
      puVar4[1] = 1;
      puVar4[2] = 1;
      return;
    }
  }
  else {
    pdVar5 = (eigensystem->fEigenvalues).super_TPZVec<double>.fStore;
    *pdVar5 = *pdVar3;
    pdVar5[1] = pdVar3[3];
    pdVar5[2] = pdVar3[5];
    if (compute_eigenvectors) {
      (*(eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>._vptr_TPZVec[4])
                (&eigensystem->fEigenvectors,3);
      local_40 = 0.0;
      TPZManVector<double,_3>::TPZManVector((TPZManVector<double,_3> *)local_78,3,&local_40);
      TPZManVector<double,_3>::operator=
                ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore,
                 (TPZManVector<double,_3> *)local_78);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)local_78);
      *(((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore)->
       super_TPZVec<double>).fStore = 1.0;
      local_40 = 0.0;
      TPZManVector<double,_3>::TPZManVector((TPZManVector<double,_3> *)local_78,3,&local_40);
      TPZManVector<double,_3>::operator=
                ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore + 1,
                 (TPZManVector<double,_3> *)local_78);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)local_78);
      (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore[1].
      super_TPZVec<double>.fStore[1] = 1.0;
      local_40 = 0.0;
      TPZManVector<double,_3>::TPZManVector((TPZManVector<double,_3> *)local_78,3,&local_40);
      TPZManVector<double,_3>::operator=
                ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore + 2,
                 (TPZManVector<double,_3> *)local_78);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)local_78);
      (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore[2].
      super_TPZVec<double>.fStore[2] = 1.0;
    }
    pdVar3 = (eigensystem->fEigenvalues).super_TPZVec<double>.fStore;
    dVar13 = *pdVar3;
    dVar1 = pdVar3[1];
    dVar15 = ABS(dVar13 - dVar1);
    dVar16 = ABS(dVar1 - pdVar3[2]);
    if ((local_38 < dVar15) || (local_38 < dVar16)) {
      if ((dVar15 <= local_38) || ((dVar16 <= local_38 || (ABS(dVar13 - pdVar3[2]) <= local_38)))) {
        uVar11 = (ulong)(local_38 < dVar16);
        bVar7 = local_38 < dVar15;
        eigensystem->fDistinctEigenvalues = 2;
        if (!bVar7) {
          uVar11 = 2;
        }
        puVar4 = (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore;
        puVar4[uVar11] = 1;
        puVar4[bVar7 && local_38 >= dVar16] = 2;
        puVar4[bVar7 + 1] = 2;
      }
      else {
        eigensystem->fDistinctEigenvalues = 3;
        puVar4 = (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore;
        puVar4[0] = 1;
        puVar4[1] = 1;
        puVar4[2] = 1;
      }
      if (dVar13 < dVar1) {
        *pdVar3 = dVar1;
        pdVar3[1] = dVar13;
        puVar4 = (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore;
        uVar2 = *(undefined8 *)puVar4;
        *(ulong *)puVar4 = CONCAT44((int)uVar2,(int)((ulong)uVar2 >> 0x20));
        if (compute_eigenvectors) {
          pTVar6 = (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore;
          stack0xffffffffffffff90 = (undefined1  [16])0x0;
          local_60 = 0;
          local_78._0_8_ = &PTR__TPZManVector_01841aa0;
          uVar11 = (pTVar6->super_TPZVec<double>).fNElements;
          if ((long)uVar11 < 4) {
            local_78._8_8_ = local_58;
            local_60 = 0;
          }
          else {
            local_78._8_8_ = operator_new__(-(ulong)(uVar11 >> 0x3d != 0) | uVar11 * 8);
            local_60 = uVar11;
          }
          uStack_68 = uVar11;
          if (0 < (long)uVar11) {
            pdVar3 = (pTVar6->super_TPZVec<double>).fStore;
            uVar12 = 0;
            do {
              *(double *)(local_78._8_8_ + uVar12 * 8) = pdVar3[uVar12];
              uVar12 = uVar12 + 1;
            } while (uVar11 != uVar12);
          }
          TPZManVector<double,_3>::operator=(pTVar6,pTVar6 + 1);
          TPZManVector<double,_3>::operator=
                    ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore + 1,
                     (TPZManVector<double,_3> *)local_78);
          TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)local_78);
        }
      }
      pdVar3 = (eigensystem->fEigenvalues).super_TPZVec<double>.fStore;
      dVar13 = pdVar3[1];
      if (dVar13 < pdVar3[2]) {
        pdVar3[1] = pdVar3[2];
        pdVar3[2] = dVar13;
        puVar4 = (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore;
        uVar2 = *(undefined8 *)(puVar4 + 1);
        *(ulong *)(puVar4 + 1) = CONCAT44((int)uVar2,(int)((ulong)uVar2 >> 0x20));
        if (compute_eigenvectors) {
          pTVar6 = (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore;
          stack0xffffffffffffff90 = (undefined1  [16])0x0;
          local_60 = 0;
          local_78._0_8_ = &PTR__TPZManVector_01841aa0;
          uVar11 = pTVar6[1].super_TPZVec<double>.fNElements;
          if ((long)uVar11 < 4) {
            local_78._8_8_ = local_58;
            local_60 = 0;
          }
          else {
            local_78._8_8_ = operator_new__(-(ulong)(uVar11 >> 0x3d != 0) | uVar11 * 8);
            local_60 = uVar11;
          }
          uStack_68 = uVar11;
          if (0 < (long)uVar11) {
            pdVar3 = pTVar6[1].super_TPZVec<double>.fStore;
            uVar12 = 0;
            do {
              *(double *)(local_78._8_8_ + uVar12 * 8) = pdVar3[uVar12];
              uVar12 = uVar12 + 1;
            } while (uVar11 != uVar12);
          }
          TPZManVector<double,_3>::operator=(pTVar6 + 1,pTVar6 + 2);
          TPZManVector<double,_3>::operator=
                    ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore + 2,
                     (TPZManVector<double,_3> *)local_78);
          TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)local_78);
        }
      }
      pdVar3 = (eigensystem->fEigenvalues).super_TPZVec<double>.fStore;
      dVar13 = *pdVar3;
      if (pdVar3[1] <= dVar13) {
        return;
      }
      *pdVar3 = pdVar3[1];
      pdVar3[1] = dVar13;
      puVar4 = (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore;
      uVar2 = *(undefined8 *)puVar4;
      *(ulong *)puVar4 = CONCAT44((int)uVar2,(int)((ulong)uVar2 >> 0x20));
      if (!compute_eigenvectors) {
        return;
      }
      pTVar6 = (eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore;
      stack0xffffffffffffff90 = (undefined1  [16])0x0;
      local_60 = 0;
      local_78._0_8_ = &PTR__TPZManVector_01841aa0;
      uVar11 = (pTVar6->super_TPZVec<double>).fNElements;
      if ((long)uVar11 < 4) {
        local_78._8_8_ = local_58;
        local_60 = 0;
      }
      else {
        local_78._8_8_ = operator_new__(-(ulong)(uVar11 >> 0x3d != 0) | uVar11 * 8);
        local_60 = uVar11;
      }
      uStack_68 = uVar11;
      if (0 < (long)uVar11) {
        pdVar3 = (pTVar6->super_TPZVec<double>).fStore;
        uVar12 = 0;
        do {
          *(double *)(local_78._8_8_ + uVar12 * 8) = pdVar3[uVar12];
          uVar12 = uVar12 + 1;
        } while (uVar11 != uVar12);
      }
      TPZManVector<double,_3>::operator=(pTVar6,pTVar6 + 1);
      TPZManVector<double,_3>::operator=
                ((eigensystem->fEigenvectors).super_TPZVec<TPZManVector<double,_3>_>.fStore + 1,
                 (TPZManVector<double,_3> *)local_78);
      TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)local_78);
      return;
    }
  }
  eigensystem->fDistinctEigenvalues = 1;
  puVar4 = (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore;
  puVar4[0] = 3;
  puVar4[1] = 3;
  puVar4[2] = 3;
  return;
}

Assistant:

void TPZTensor<T>::ComputeEigenvalues(TPZDecomposed &eigensystem, const bool compute_eigenvectors) const {
    TPZManVector<T, 3> &eigenvalues = eigensystem.fEigenvalues;
    TPZManVector<TPZManVector<T, 3>, 3> &eigenvectors = eigensystem.fEigenvectors;

    T tol = Norm()*1.e-12;

    if (this->IsZeroTensor(tol)) {
        eigensystem.fDistinctEigenvalues = 1;
        eigenvalues[0] = eigenvalues[1] = eigenvalues[2] = 0.;
        eigensystem.fGeometricMultiplicity[0] = 3;
        eigensystem.fGeometricMultiplicity[1] = 3;
        eigensystem.fGeometricMultiplicity[2] = 3;
        if (compute_eigenvectors) {
            eigenvectors[0] = TPZManVector<T, 3>(3, 0.);
            eigenvectors[0][0] = 1.0;
            eigenvectors[1] = TPZManVector<T, 3>(3, 0.);
            eigenvectors[1][1] = 1.0;
            eigenvectors[2] = TPZManVector<T, 3>(3, 0.);
            eigenvectors[2][2] = 1.0;
        }
    } else if (this->IsDiagonal(tol)) {
        eigenvalues[0] = this->XX();
        eigenvalues[1] = this->YY();
        eigenvalues[2] = this->ZZ();

        if (compute_eigenvectors) {
            eigenvectors.resize(3);
            eigenvectors[0] = TPZManVector<T, 3>(3, 0.);
            eigenvectors[0][0] = 1.0;
            eigenvectors[1] = TPZManVector<T, 3>(3, 0.);
            eigenvectors[1][1] = 1.0;
            eigenvectors[2] = TPZManVector<T, 3>(3, 0.);
            eigenvectors[2][2] = 1.0;
        }

        bool ev0eqev1 = AreEqual(eigenvalues[0], eigenvalues[1], tol);
        bool ev1eqev2 = AreEqual(eigenvalues[1], eigenvalues[2], tol);

        if (ev0eqev1 && ev1eqev2) {
            //tres autovalores iguais
            eigensystem.fDistinctEigenvalues = 1;
            eigensystem.fGeometricMultiplicity[0] = 3;
            eigensystem.fGeometricMultiplicity[1] = 3;
            eigensystem.fGeometricMultiplicity[2] = 3;
            return;
        } else if (ev0eqev1 || ev1eqev2 || AreEqual(eigenvalues[0], eigenvalues[2], tol)) {
            eigensystem.fDistinctEigenvalues = 2;
            int different = -1;
            int equals[2] = {-1, -1};
            if (ev0eqev1) {
                different = 2;
                equals[0] = 0;
                equals[1] = 1;
            } else if (ev1eqev2) {
                different = 0;
                equals[0] = 1;
                equals[1] = 2;
            } else {
                different = 1;
                equals[0] = 0;
                equals[1] = 2;
            }
            eigensystem.fGeometricMultiplicity[different] = 1;
            eigensystem.fGeometricMultiplicity[equals[0]] = 2;
            eigensystem.fGeometricMultiplicity[equals[1]] = 2;
        } else {
            eigensystem.fDistinctEigenvalues = 3;
            eigensystem.fGeometricMultiplicity[0] = 1;
            eigensystem.fGeometricMultiplicity[1] = 1;
            eigensystem.fGeometricMultiplicity[2] = 1;
        }

        if (eigenvalues[0] < eigenvalues[1]) {
            T eigenvalueTemp = eigenvalues[0];
            eigenvalues[0] = eigenvalues[1];
            eigenvalues[1] = eigenvalueTemp;
            std::swap(eigensystem.fGeometricMultiplicity[0], eigensystem.fGeometricMultiplicity[1]);
            if (compute_eigenvectors) {
                auto temp = eigenvectors[0];
                eigenvectors[0] = eigenvectors[1];
                eigenvectors[1] = temp;
            }
        }
        if (eigenvalues[1] < eigenvalues[2]) {
            T eigenvalueTemp = eigenvalues[1];
            eigenvalues[1] = eigenvalues[2];
            eigenvalues[2] = eigenvalueTemp;
            std::swap(eigensystem.fGeometricMultiplicity[1], eigensystem.fGeometricMultiplicity[2]);
            if (compute_eigenvectors) {
                auto temp = eigenvectors[1];
                eigenvectors[1] = eigenvectors[2];
                eigenvectors[2] = temp;
            }
        }
        if (eigenvalues[0] < eigenvalues[1]) {
            T eigenvalueTemp = eigenvalues[0];
            eigenvalues[0] = eigenvalues[1];
            eigenvalues[1] = eigenvalueTemp;
            std::swap(eigensystem.fGeometricMultiplicity[0], eigensystem.fGeometricMultiplicity[1]);
            if (compute_eigenvectors) {
                auto temp = eigenvectors[0];
                eigenvectors[0] = eigenvectors[1];
                eigenvectors[1] = temp;
            }
        }
    } else {
        this->DirectEigenValues(eigensystem, compute_eigenvectors);

        bool ev0eqev1 = AreEqual(eigenvalues[0], eigenvalues[1], tol);
        bool ev1eqev2 = AreEqual(eigenvalues[1], eigenvalues[2], tol);
        //tres autovalores iguais
        if (ev0eqev1 && ev1eqev2) {
            eigensystem.fDistinctEigenvalues = 1;
            eigensystem.fGeometricMultiplicity[0] = 3;
            eigensystem.fGeometricMultiplicity[1] = 3;
            eigensystem.fGeometricMultiplicity[2] = 3;
        } else if (ev0eqev1 || ev1eqev2) {
            //dois autovalores iguais
            eigensystem.fDistinctEigenvalues = 2;

            int different = -1;
            int equals = -1;
            if (ev0eqev1) {
                different = 2;
                equals = 0;
            } else {
                different = 0;
                equals = 2;
            }
            eigensystem.fGeometricMultiplicity[1] = 2;
            eigensystem.fGeometricMultiplicity[equals] = 2;
            eigensystem.fGeometricMultiplicity[different] = 1;
        } else {
            //3 autovalores diferentes
            eigensystem.fDistinctEigenvalues = 3;
            eigensystem.fGeometricMultiplicity[0] = 1;
            eigensystem.fGeometricMultiplicity[1] = 1;
            eigensystem.fGeometricMultiplicity[2] = 1;
        }
    }
}